

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Cube::setupFrontFace(Cube *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int i;
  long lVar3;
  undefined8 local_48;
  undefined8 local_40;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  undefined8 local_18;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_48._0_4_ = this->x;
  local_48._4_4_ = this->y;
  uVar1 = this->l;
  uVar2 = this->b;
  local_30 = (float)(undefined4)local_48 + (float)uVar1;
  local_34 = this->z + (float)uVar2;
  local_40 = CONCAT44(local_30,local_34);
  local_38 = (float)local_48._4_4_;
  local_2c = (float)local_48._4_4_ + this->h;
  local_28 = local_34;
  local_24 = local_30;
  local_20 = local_2c;
  local_1c = local_34;
  local_18 = local_48;
  local_10 = local_34;
  local_c = (float)(undefined4)local_48;
  local_8 = local_2c;
  local_4 = local_34;
  for (lVar3 = 0; lVar3 != 0x12; lVar3 = lVar3 + 1) {
    this->positionData[lVar3] = *(float *)((long)&local_48 + lVar3 * 4);
  }
  return;
}

Assistant:

void setupFrontFace() {
        float frontFace[]={
            x,y,z+b,
            x+l,y,z+b,
            x+l,y+h,z+b,
            x+l,y+h,z+b,
            x,y,z+b,
            x,y+h,z+b

        };

        arrayCopy(frontFace,positionData,0);
    }